

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataSocket.cpp
# Opt level: O0

void __thiscall brynet::net::DataSocket::canRecv(DataSocket *this)

{
  size_t in_RCX;
  void *in_RDX;
  int in_ESI;
  int in_R8D;
  DataSocket *this_local;
  
  recv(this,in_ESI,in_RDX,in_RCX,in_R8D);
  return;
}

Assistant:

void DataSocket::canRecv()
{
#ifdef PLATFORM_WINDOWS
    mPostRecvCheck = false;
    if (mSocket == nullptr && !mPostWriteCheck)
    {
        onClose();
        return;
    }
#endif

#ifdef USE_OPENSSL
    if (!mIsHandsharked && mSSL != nullptr)
    {
        processSSLHandshake();
        return;
    }
#endif

    recv();
}